

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_async_function_free(JSRuntime *rt,JSAsyncFunctionData *s)

{
  int iVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  list_head *plVar4;
  list_head *plVar5;
  JSValue v;
  JSValue v_00;
  
  (s->header).ref_count = (s->header).ref_count + -1;
  if ((s->header).ref_count != 0) {
    return;
  }
  if (s->is_active != 0) {
    async_func_free(rt,&s->func_state);
    s->is_active = 0;
  }
  iVar2 = s->resolving_funcs[0].tag;
  if (0xfffffff4 < (uint)iVar2) {
    JVar3 = (JSValueUnion)s->resolving_funcs[0].u.ptr;
    iVar1 = *JVar3.ptr;
    *(int *)JVar3.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v.tag = iVar2;
      v.u.ptr = JVar3.ptr;
      __JS_FreeValueRT(rt,v);
    }
  }
  iVar2 = s->resolving_funcs[1].tag;
  if (0xfffffff4 < (uint)iVar2) {
    JVar3 = (JSValueUnion)s->resolving_funcs[1].u.ptr;
    iVar1 = *JVar3.ptr;
    *(int *)JVar3.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v_00.tag = iVar2;
      v_00.u.ptr = JVar3.ptr;
      __JS_FreeValueRT(rt,v_00);
    }
  }
  plVar4 = (s->header).link.prev;
  plVar5 = (s->header).link.next;
  plVar4->next = plVar5;
  plVar5->prev = plVar4;
  (s->header).link.prev = (list_head *)0x0;
  (s->header).link.next = (list_head *)0x0;
  (*(rt->mf).js_free)(&rt->malloc_state,s);
  return;
}

Assistant:

static void js_async_function_free(JSRuntime *rt, JSAsyncFunctionData *s)
{
    if (--s->header.ref_count == 0) {
        js_async_function_free0(rt, s);
    }
}